

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFilePrepend(char *name,void *buf,size_t count)

{
  void *pvVar1;
  bool_t bVar2;
  err_t eVar3;
  file_t pFVar4;
  size_t offset;
  blob_t blob;
  size_t sVar5;
  size_t c;
  size_t local_48;
  void *local_40;
  size_t local_38;
  
  local_38 = count;
  pFVar4 = fileOpen(name,"r+b");
  if (pFVar4 == (file_t)0x0) {
    pFVar4 = fileOpen(name,"rb");
    if (pFVar4 != (file_t)0x0) {
      fileClose(pFVar4);
      return 0xcb;
    }
    eVar3 = cmdFileWrite(name,buf,count);
    return eVar3;
  }
  offset = fileSize(pFVar4);
  if (offset == 0xffffffffffffffff) {
    fileClose(pFVar4);
    return 0xcf;
  }
  blob = blobCreate(0x1000);
  if (blob == (blob_t)0x0) {
    fileClose(pFVar4);
    return 0x6e;
  }
  pvVar1 = buf;
  if (offset == 0) {
    blobClose(blob);
  }
  else {
    do {
      local_40 = pvVar1;
      local_48 = 0x1000;
      if (offset < 0x1000) {
        local_48 = offset;
      }
      offset = offset - local_48;
      bVar2 = fileSeek(pFVar4,offset,0);
      if (((bVar2 == 0) || (sVar5 = fileRead2(blob,local_48,pFVar4), sVar5 != local_48)) ||
         (bVar2 = fileSeek(pFVar4,offset + count,0), bVar2 == 0)) {
        blobClose(blob);
        goto LAB_00104010;
      }
      eVar3 = fileWrite(&local_48,blob,local_48,pFVar4);
    } while ((eVar3 == 0) && (pvVar1 = local_40, offset != 0));
    blobClose(blob);
    buf = local_40;
    if (eVar3 != 0) goto LAB_00104016;
  }
  bVar2 = fileSeek(pFVar4,0,0);
  if (bVar2 == 0) {
LAB_00104010:
    eVar3 = 0xcf;
  }
  else {
    eVar3 = fileWrite(&local_38,buf,count,pFVar4);
    if (eVar3 == 0) {
      bVar2 = fileClose(pFVar4);
      if (bVar2 == 0) {
        return 0x67;
      }
      return 0;
    }
  }
LAB_00104016:
  fileClose(pFVar4);
  return eVar3;
}

Assistant:

err_t cmdFilePrepend(const char* name, const void* buf, size_t count)
{
	const size_t buf1_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf1;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(buf, count));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	if (code != ERR_OK)
	{
		// не открывается, но существует?
		code = cmdFileOpen(file, name, "rb");
		if (code == ERR_OK)
		{
			cmdFileClose(file);
			return ERR_FILE_OPEN;
		}
		// не существует => создать
		return cmdFileWrite(name, buf, count);
	}
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
	{
		cmdFileClose(file);
		return ERR_FILE_READ;
	}
	// сдвинуть содержимое файла вправо
	code = cmdBlobCreate(buf1, buf1_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = size; code == ERR_OK && pos;)
	{
		size_t c;
		c = MIN2(buf1_size, pos), pos -= c;
		if (!fileSeek(file, pos, SEEK_SET) ||
			fileRead2(buf1, c, file) != c ||
			!fileSeek(file, pos + count, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf1, c, file);
	}
	cmdBlobClose(buf1);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// дописать в начало
	if (!fileSeek(file, 0, SEEK_SET))
		code = ERR_FILE_READ;
	else
		code = fileWrite(&count, buf, count, file);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}